

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

SmallBuffer * helics::typeConvertDefV(defV *val)

{
  char *pcVar1;
  int in_EDX;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RSI;
  SmallBuffer *in_RDI;
  NamedPoint *in_stack_00000120;
  DataType in_stack_0000012c;
  double in_stack_00000130;
  DataType in_stack_0000013c;
  int64_t in_stack_00000180;
  DataType in_stack_0000018c;
  DataType in_stack_000001ec;
  undefined1 in_stack_000001f0 [16];
  complex<double> *in_stack_00000220;
  DataType in_stack_0000022c;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_00000230;
  DataType in_stack_0000023c;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  pcVar1 = CLI::std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RSI,(char *)in_RSI,in_EDX);
  switch(pcVar1) {
  case (char *)0x0:
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba691);
    typeConvert(in_stack_0000013c,in_stack_00000130);
    break;
  case (char *)0x1:
    std::
    get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba6b2);
    typeConvert(in_stack_0000018c,in_stack_00000180);
    break;
  case (char *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba6d4);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    typeConvert(in_stack_000001ec,(string_view)in_stack_000001f0);
    break;
  case (char *)0x3:
    std::
    get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba707);
    typeConvert(in_stack_0000022c,in_stack_00000220);
    break;
  case (char *)0x4:
    std::
    get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba724);
    typeConvert(in_stack_ffffffffffffffe0._12_4_,in_stack_ffffffffffffffe0._0_8_);
    break;
  case (char *)0x5:
    std::
    get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba741);
    typeConvert(in_stack_0000023c,in_stack_00000230);
    break;
  case (char *)0x6:
    std::
    get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2ba75e);
    typeConvert(in_stack_0000012c,in_stack_00000120);
  }
  return in_RDI;
}

Assistant:

SmallBuffer typeConvertDefV(const defV& val)
{
    switch (val.index()) {
        case double_loc:  // double
            return typeConvert(DataType::HELICS_DOUBLE, std::get<double>(val));
        case int_loc:  // int64_t
            return typeConvert(DataType::HELICS_INT, std::get<int64_t>(val));
        case string_loc:  // string
        default:
            return typeConvert(DataType::HELICS_STRING,
                               std::string_view{std::get<std::string>(val)});
        case complex_loc:  // complex
            return typeConvert(DataType::HELICS_COMPLEX, std::get<std::complex<double>>(val));
        case vector_loc:  // vector
            return typeConvert(DataType::HELICS_VECTOR, std::get<std::vector<double>>(val));
        case complex_vector_loc:  // complex
            return typeConvert(DataType::HELICS_COMPLEX_VECTOR,
                               std::get<std::vector<std::complex<double>>>(val));
        case named_point_loc:
            return typeConvert(DataType::HELICS_NAMED_POINT, std::get<NamedPoint>(val));
    }
}